

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O1

void __thiscall soul::ResolutionPass::TypeResolver::~TypeResolver(TypeResolver *this)

{
  TypeDeclarationBase **ppTVar1;
  
  (this->super_ErrorIgnoringRewritingASTVisitor).super_RewritingASTVisitor._vptr_RewritingASTVisitor
       = (_func_int **)&PTR__TypeResolver_002d78b0;
  (this->recursiveTypeDeclVisitStack).stack.numActive = 0;
  if (8 < (this->recursiveTypeDeclVisitStack).stack.numAllocated) {
    ppTVar1 = (this->recursiveTypeDeclVisitStack).stack.items;
    if (ppTVar1 != (TypeDeclarationBase **)0x0) {
      operator_delete__(ppTVar1);
    }
    (this->recursiveTypeDeclVisitStack).stack.items =
         (TypeDeclarationBase **)(this->recursiveTypeDeclVisitStack).stack.space;
    (this->recursiveTypeDeclVisitStack).stack.numAllocated = 8;
  }
  operator_delete(this,0x98);
  return;
}

Assistant:

static inline constexpr const char* getPassName()  { return "TypeResolver"; }